

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

lys_module *
lyp_search_file(ly_ctx *ctx,lys_module *module,char *name,char *revision,int implement,
               unres_schema *unres)

{
  long lVar1;
  int iVar2;
  LY_ERR *pLVar3;
  int *piVar4;
  char *pcVar5;
  dirent *pdVar6;
  size_t sVar7;
  char *pcVar8;
  lys_revision *local_1a8;
  undefined1 local_158 [8];
  stat st;
  ly_set *dirs;
  ly_ctx *plStack_b8;
  uint u;
  lys_module *result;
  LYS_INFORMAT match_format;
  LYS_INFORMAT format;
  char *filename;
  char *rev;
  char *dot;
  char *match_name;
  dirent *file;
  DIR *dir;
  char *wn;
  char *wd;
  int i;
  int fd;
  size_t dir_len;
  size_t match_len;
  size_t flen;
  size_t len;
  unres_schema *unres_local;
  char *pcStack_30;
  int implement_local;
  char *revision_local;
  char *name_local;
  lys_module *module_local;
  ly_ctx *ctx_local;
  
  dir_len = 0;
  dir = (DIR *)0x0;
  file = (dirent *)0x0;
  dot = (char *)0x0;
  result._0_4_ = LYS_IN_UNKNOWN;
  plStack_b8 = (ly_ctx *)0x0;
  len = (size_t)unres;
  unres_local._4_4_ = implement;
  pcStack_30 = revision;
  revision_local = name;
  name_local = (char *)module;
  module_local = (lys_module *)ctx;
  st.__glibc_reserved[2] = (__syscall_slong_t)ly_set_new();
  if ((ly_set *)st.__glibc_reserved[2] == (ly_set *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_search_file");
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    flen = strlen(revision_local);
    wn = get_current_dir_name();
    if (wn == (char *)0x0) {
      pLVar3 = ly_errno_location();
      *pLVar3 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_search_file");
    }
    else {
      iVar2 = ly_set_add((ly_set *)st.__glibc_reserved[2],wn,0);
      if (iVar2 != -1) {
        if (module_local[0x8b].data != (lys_node *)0x0) {
          wd._0_4_ = 0;
          while (*(long *)((module_local[0x8b].data)->padding + (long)(int)wd * 8 + -0x1c) != 0) {
            wn = strdup(*(char **)((module_local[0x8b].data)->padding + (long)(int)wd * 8 + -0x1c));
            if (wn == (char *)0x0) {
              pLVar3 = ly_errno_location();
              *pLVar3 = LY_EMEM;
              ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_search_file");
              goto LAB_0012e44e;
            }
            iVar2 = ly_set_add((ly_set *)st.__glibc_reserved[2],wn,0);
            if (iVar2 == -1) goto LAB_0012e44e;
            wd._0_4_ = (int)wd + 1;
          }
        }
        wn = (char *)0x0;
        while (*(int *)(st.__glibc_reserved[2] + 4) != 0) {
          free(wn);
          free(dir);
          dir = (DIR *)0x0;
          *(int *)(st.__glibc_reserved[2] + 4) = *(int *)(st.__glibc_reserved[2] + 4) + -1;
          wn = *(char **)(*(long *)(st.__glibc_reserved[2] + 8) +
                         (ulong)*(uint *)(st.__glibc_reserved[2] + 4) * 8);
          *(undefined8 *)
           (*(long *)(st.__glibc_reserved[2] + 8) + (ulong)*(uint *)(st.__glibc_reserved[2] + 4) * 8
           ) = 0;
          if ('\x01' < ly_log_level) {
            ly_log(LY_LLVRB,"Searching for \"%s\" in %s.",revision_local,wn);
          }
          if (file != (dirent *)0x0) {
            closedir((DIR *)file);
          }
          file = (dirent *)opendir(wn);
          _i = strlen(wn);
          pcVar8 = wn;
          if (file == (dirent *)0x0) {
            if ('\0' < ly_log_level) {
              piVar4 = __errno_location();
              pcVar5 = strerror(*piVar4);
              ly_log(LY_LLWRN,"Unable to open directory \"%s\" for searching (sub)modules (%s).",
                     pcVar8,pcVar5);
            }
          }
          else {
LAB_0012db91:
            pdVar6 = readdir((DIR *)file);
            if (pdVar6 != (dirent *)0x0) {
              iVar2 = strcmp(".",pdVar6->d_name);
              if ((iVar2 != 0) && (iVar2 = strcmp("..",pdVar6->d_name), iVar2 != 0)) {
                free(dir);
                iVar2 = asprintf((char **)&dir,"%s/%s",wn,pdVar6->d_name);
                if (iVar2 == -1) {
                  pLVar3 = ly_errno_location();
                  *pLVar3 = LY_EMEM;
                  ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyp_search_file");
                  goto LAB_0012e44e;
                }
                iVar2 = stat((char *)dir,(stat *)local_158);
                pcVar8 = wn;
                if (iVar2 == -1) {
                  if ('\0' < ly_log_level) {
                    piVar4 = __errno_location();
                    pcVar5 = strerror(*piVar4);
                    ly_log(LY_LLWRN,
                           "Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)"
                           ,pdVar6->d_name,pcVar8,pcVar5);
                  }
                }
                else if ((((uint)st.st_nlink & 0xf000) == 0x4000) &&
                        (*(int *)(st.__glibc_reserved[2] + 4) != 0)) {
                  iVar2 = ly_set_add((ly_set *)st.__glibc_reserved[2],dir,0);
                  if (iVar2 == -1) goto LAB_0012e44e;
                  dir = (DIR *)0x0;
                }
                else if (((((uint)st.st_nlink & 0xf000) == 0x8000) &&
                         (iVar2 = strncmp(revision_local,pdVar6->d_name,flen), iVar2 == 0)) &&
                        ((pdVar6->d_name[flen] == '.' || (pdVar6->d_name[flen] == '@')))) {
                  match_len = strlen(pdVar6->d_name);
                  iVar2 = strcmp(pdVar6->d_name + (match_len - 4),".yin");
                  if (iVar2 == 0) {
                    result._4_4_ = LYS_IN_YIN;
                  }
                  else {
                    iVar2 = strcmp(pdVar6->d_name + (match_len - 5),".yang");
                    if (iVar2 != 0) goto LAB_0012db91;
                    result._4_4_ = LYS_IN_YANG;
                  }
                  pcVar8 = pcStack_30;
                  if (pcStack_30 == (char *)0x0) {
                    if (dot != (char *)0x0) {
                      if (((pdVar6->d_name[flen] != '@') ||
                          (iVar2 = lyp_check_date(pdVar6->d_name + flen + 1), iVar2 != 0)) ||
                         ((dot[dir_len] == '@' &&
                          (iVar2 = strncmp(dot + dir_len + 1,pdVar6->d_name + flen + 1,10),
                          -1 < iVar2)))) goto LAB_0012db91;
                      free(dot);
                    }
                    dot = (char *)dir;
                    dir = (DIR *)0x0;
                    dir_len = _i + 1 + flen;
                    result._0_4_ = result._4_4_;
                    goto LAB_0012db91;
                  }
                  if (pdVar6->d_name[flen] == '@') {
                    lVar1 = flen + 1;
                    sVar7 = strlen(pcStack_30);
                    iVar2 = strncmp(pcVar8,pdVar6->d_name + lVar1,sVar7);
                    if (iVar2 == 0) {
                      free(dot);
                      dot = (char *)dir;
                      dir = (DIR *)0x0;
                      dir_len = _i + 1 + flen;
                      result._0_4_ = result._4_4_;
                      goto LAB_0012dfe7;
                    }
                  }
                  else {
                    free(dot);
                    dot = (char *)dir;
                    dir = (DIR *)0x0;
                    dir_len = _i + 1 + flen;
                    result._0_4_ = result._4_4_;
                  }
                }
              }
              goto LAB_0012db91;
            }
          }
        }
        if (dot == (char *)0x0) {
          if ((name_local == (char *)0x0) && (pcStack_30 == (char *)0x0)) {
            plStack_b8 = (ly_ctx *)
                         ly_ctx_get_module((ly_ctx *)module_local,revision_local,(char *)0x0);
          }
          if (plStack_b8 == (ly_ctx *)0x0) {
            pLVar3 = ly_errno_location();
            *pLVar3 = LY_ESYS;
            ly_log(LY_LLERR,"Data model \"%s\" not found.",revision_local);
          }
        }
        else {
LAB_0012dfe7:
          if ('\x01' < ly_log_level) {
            ly_log(LY_LLVRB,"Loading schema from \"%s\" file.",dot);
          }
          pcVar8 = strrchr(dot,0x2e);
          pcVar8[1] = '\0';
          if (pcStack_30 == (char *)0x0) {
            for (wd._0_4_ = 0; (int)wd < *(int *)((long)&module_local[0x8b].ns + 4);
                wd._0_4_ = (int)wd + 1) {
              if (((&((module_local[0x8c].ctx)->dict).recs[0].next)[(int)wd][2].value != (char *)0x0
                  ) && (iVar2 = strcmp(revision_local,
                                       (&((module_local[0x8c].ctx)->dict).recs[0].next)[(int)wd]->
                                       value), iVar2 == 0)) {
                pcVar5 = (&((module_local[0x8c].ctx)->dict).recs[0].next)[(int)wd][2].value;
                sVar7 = strlen(dot);
                iVar2 = strncmp(dot,pcVar5,sVar7);
                if (iVar2 == 0) {
                  plStack_b8 = (ly_ctx *)(&((module_local[0x8c].ctx)->dict).recs[0].next)[(int)wd];
                  if ((unres_local._4_4_ == 0) ||
                     ((char)(plStack_b8->dict).recs[2].field_0x10 < '\0')) {
                    if (((byte)(plStack_b8->dict).recs[2].field_0x10 >> 6 & 1) != 0) {
                      lys_set_enabled((lys_module *)plStack_b8);
                    }
                  }
                  else {
                    iVar2 = lys_set_implemented((lys_module *)plStack_b8);
                    if (iVar2 != 0) {
                      plStack_b8 = (ly_ctx *)0x0;
                    }
                  }
                  goto LAB_0012e44e;
                }
              }
            }
          }
          pcVar8[1] = 'y';
          wd._4_4_ = open(dot,0);
          if (wd._4_4_ < 0) {
            pLVar3 = ly_errno_location();
            *pLVar3 = LY_ESYS;
            piVar4 = __errno_location();
            pcVar8 = strerror(*piVar4);
            ly_log(LY_LLERR,"Unable to open data model file \"%s\" (%s).",dot,pcVar8);
          }
          else {
            if (name_local == (char *)0x0) {
              plStack_b8 = (ly_ctx *)
                           lys_read_import((ly_ctx *)module_local,wd._4_4_,(LYS_INFORMAT)result,
                                           pcStack_30,unres_local._4_4_);
            }
            else {
              plStack_b8 = (ly_ctx *)
                           lys_sub_parse_fd((lys_module *)name_local,wd._4_4_,(LYS_INFORMAT)result,
                                            (unres_schema *)len);
            }
            close(wd._4_4_);
            if (plStack_b8 != (ly_ctx *)0x0) {
              _match_format = strrchr(dot,0x2f);
              if (_match_format == (char *)0x0) {
                _match_format = dot;
              }
              else {
                _match_format = _match_format + 1;
              }
              pcVar5 = strchr(_match_format,0x40);
              flen = strlen((plStack_b8->dict).recs[0].value);
              iVar2 = strncmp(_match_format,(plStack_b8->dict).recs[0].value,flen);
              if ((((iVar2 != 0) || ((pcVar5 != (char *)0x0 && (pcVar5 != _match_format + flen))))
                  || ((pcVar5 == (char *)0x0 && (pcVar8 != _match_format + flen)))) &&
                 ('\0' < ly_log_level)) {
                ly_log(LY_LLWRN,"File name \"%s\" does not match module name \"%s\".",_match_format,
                       (plStack_b8->dict).recs[0].value);
              }
              if (pcVar5 != (char *)0x0) {
                flen = (long)pcVar8 - (long)(pcVar5 + 1);
                if (((((plStack_b8->dict).recs[2].field_0x11 == '\0') || (flen != 10)) ||
                    (iVar2 = strncmp((char *)(plStack_b8->dict).recs[3].value,pcVar5 + 1,10),
                    iVar2 != 0)) && ('\0' < ly_log_level)) {
                  if ((plStack_b8->dict).recs[2].field_0x11 == '\0') {
                    local_1a8 = (lys_revision *)0x1c884b;
                  }
                  else {
                    local_1a8 = (lys_revision *)(plStack_b8->dict).recs[3].value;
                  }
                  ly_log(LY_LLWRN,"File name \"%s\" does not match module revision \"%s\".",
                         _match_format,local_1a8);
                }
              }
              pcVar8 = lydict_insert_zc((ly_ctx *)module_local,dot);
              (plStack_b8->dict).recs[2].value = pcVar8;
              dot = (char *)0x0;
            }
          }
        }
      }
    }
LAB_0012e44e:
    free(dir);
    free(wn);
    if (file != (dirent *)0x0) {
      closedir((DIR *)file);
    }
    free(dot);
    for (dirs._4_4_ = 0; dirs._4_4_ < *(uint *)(st.__glibc_reserved[2] + 4);
        dirs._4_4_ = dirs._4_4_ + 1) {
      free(*(void **)(*(long *)(st.__glibc_reserved[2] + 8) + (ulong)dirs._4_4_ * 8));
    }
    ly_set_free((ly_set *)st.__glibc_reserved[2]);
    ctx_local = plStack_b8;
  }
  return (lys_module *)ctx_local;
}

Assistant:

struct lys_module *
lyp_search_file(struct ly_ctx *ctx, struct lys_module *module, const char *name, const char *revision,
                int implement, struct unres_schema *unres)
{
    size_t len, flen, match_len = 0, dir_len;
    int fd, i;
    char *wd, *wn = NULL;
    DIR *dir = NULL;
    struct dirent *file;
    char *match_name = NULL, *dot, *rev, *filename;
    LYS_INFORMAT format, match_format = 0;
    struct lys_module *result = NULL;
    unsigned int u;
    struct ly_set *dirs;
    struct stat st;

    /* start to fill the dir fifo with the context's search path (if set)
     * and the current working directory */
    dirs = ly_set_new();
    if (!dirs) {
        LOGMEM;
        return NULL;
    }

    len = strlen(name);
    wd = get_current_dir_name();
    if (!wd) {
        LOGMEM;
        goto cleanup;
    } else if (ly_set_add(dirs, wd, 0) == -1) {
        goto cleanup;
    }
    if (ctx->models.search_paths) {
        for (i = 0; ctx->models.search_paths[i]; i++) {
            wd = strdup(ctx->models.search_paths[i]);
            if (!wd) {
                LOGMEM;
                goto cleanup;
            } else if (ly_set_add(dirs, wd, 0) == -1) {
                goto cleanup;
            }
        }
    }
    wd = NULL;

    /* start searching */
    while (dirs->number) {
        free(wd);
        free(wn); wn = NULL;

        dirs->number--;
        wd = (char *)dirs->set.g[dirs->number];
        dirs->set.g[dirs->number] = NULL;
        LOGVRB("Searching for \"%s\" in %s.", name, wd);

        if (dir) {
            closedir(dir);
        }
        dir = opendir(wd);
        dir_len = strlen(wd);
        if (!dir) {
            LOGWRN("Unable to open directory \"%s\" for searching (sub)modules (%s).", wd, strerror(errno));
        } else {
            while ((file = readdir(dir))) {
                if (!strcmp(".", file->d_name) || !strcmp("..", file->d_name)) {
                    /* skip . and .. */
                    continue;
                }
                free(wn);
                if (asprintf(&wn, "%s/%s", wd, file->d_name) == -1) {
                    LOGMEM;
                    goto cleanup;
                }
                if (stat(wn, &st) == -1) {
                    LOGWRN("Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)",
                           file->d_name, wd, strerror(errno));
                    continue;
                }
                if (S_ISDIR(st.st_mode) && dirs->number) {
                    /* we have another subdirectory in searchpath to explore,
                     * subdirectories are not taken into account in current working dir (dirs->set.g[0]) */
                    if (ly_set_add(dirs, wn, 0) == -1) {
                        goto cleanup;
                    }
                    /* continue with the next item in current directory */
                    wn = NULL;
                    continue;
                } else if (!S_ISREG(st.st_mode)) {
                    /* not a regular file (note that we see the target of symlinks instead of symlinks */
                    continue;
                }

                /* here we know that the item is a file which can contain a module */
                if (strncmp(name, file->d_name, len) ||
                        (file->d_name[len] != '.' && file->d_name[len] != '@')) {
                    /* different filename than the module we search for */
                    continue;
                }

                /* get type according to filename suffix */
                flen = strlen(file->d_name);
                if (!strcmp(&file->d_name[flen - 4], ".yin")) {
                    format = LYS_IN_YIN;
                } else if (!strcmp(&file->d_name[flen - 5], ".yang")) {
                    format = LYS_IN_YANG;
                } else {
                    /* not supportde suffix/file format */
                    continue;
                }

                if (revision) {
                    /* we look for the specific revision, try to get it from the filename */
                    if (file->d_name[len] == '@') {
                        /* check revision from the filename */
                        if (strncmp(revision, &file->d_name[len + 1], strlen(revision))) {
                            /* another revision */
                            continue;
                        } else {
                            /* exact revision */
                            free(match_name);
                            match_name = wn;
                            wn = NULL;
                            match_len = dir_len + 1 + len;
                            match_format = format;
                            goto matched;
                        }
                    } else {
                        /* continue trying to find exact revision match, use this only if not found */
                        free(match_name);
                        match_name = wn;
                        wn = NULL;
                        match_len = dir_len + 1 +len;
                        match_format = format;
                        continue;
                    }
                } else {
                    /* remember the revision and try to find the newest one */
                    if (match_name) {
                        if (file->d_name[len] != '@' || lyp_check_date(&file->d_name[len + 1])) {
                            continue;
                        } else if (match_name[match_len] == '@' &&
                                (strncmp(&match_name[match_len + 1], &file->d_name[len + 1], LY_REV_SIZE - 1) >= 0)) {
                            continue;
                        }
                        free(match_name);
                    }

                    match_name = wn;
                    wn = NULL;
                    match_len = dir_len + 1 + len;
                    match_format = format;
                    continue;
                }
            }
        }
    }

    if (!match_name) {
        if (!module && !revision) {
            /* otherwise the module would be already taken from the context */
            result = (struct lys_module *)ly_ctx_get_module(ctx, name, revision);
        }
        if (!result) {
            LOGERR(LY_ESYS, "Data model \"%s\" not found.", name);
        }
        goto cleanup;
    }

matched:
    LOGVRB("Loading schema from \"%s\" file.", match_name);

    /* cut the format for now */
    dot = strrchr(match_name, '.');
    dot[1] = '\0';

    /* check that the same file was not already loaded - it make sense only in case of loading the newest revision,
     * search also in disabled module - if the matching module is disabled, it will be enabled instead of loading it */
    if (!revision) {
        for (i = 0; i < ctx->models.used; ++i) {
            if (ctx->models.list[i]->filepath && !strcmp(name, ctx->models.list[i]->name)
                    && !strncmp(match_name, ctx->models.list[i]->filepath, strlen(match_name))) {
                result = ctx->models.list[i];
                if (implement && !result->implemented) {
                    /* make it implemented now */
                    if (lys_set_implemented(result)) {
                        result = NULL;
                    }
                } else if (result->disabled) {
                    lys_set_enabled(result);
                }

                goto cleanup;
            }
        }
    }

    /* add the format back */
    dot[1] = 'y';

    /* open the file */
    fd = open(match_name, O_RDONLY);
    if (fd < 0) {
        LOGERR(LY_ESYS, "Unable to open data model file \"%s\" (%s).",
               match_name, strerror(errno));
        goto cleanup;
    }

    if (module) {
        result = (struct lys_module *)lys_sub_parse_fd(module, fd, match_format, unres);
    } else {
        result = lys_read_import(ctx, fd, match_format, revision, implement);
    }
    close(fd);

    if (!result) {
        goto cleanup;
    }

    /* check that name and revision match filename */
    filename = strrchr(match_name, '/');
    if (!filename) {
        filename = match_name;
    } else {
        filename++;
    }
    rev = strchr(filename, '@');
    /* name */
    len = strlen(result->name);
    if (strncmp(filename, result->name, len) ||
            ((rev && rev != &filename[len]) || (!rev && dot != &filename[len]))) {
        LOGWRN("File name \"%s\" does not match module name \"%s\".", filename, result->name);
    }
    if (rev) {
        len = dot - ++rev;
        if (!result->rev_size || len != 10 || strncmp(result->rev[0].date, rev, len)) {
            LOGWRN("File name \"%s\" does not match module revision \"%s\".", filename,
                   result->rev_size ? result->rev[0].date : "none");
        }
    }

    result->filepath = lydict_insert_zc(ctx, match_name);
    match_name = NULL;
    /* success */

cleanup:
    free(wn);
    free(wd);
    if (dir) {
        closedir(dir);
    }
    free(match_name);
    for (u = 0; u < dirs->number; u++) {
        free(dirs->set.g[u]);
    }
    ly_set_free(dirs);

    return result;
}